

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.h
# Opt level: O0

void __thiscall StackTrace::StackTrace(StackTrace *this)

{
  vertex_descriptor vVar1;
  vertex_property_type local_30 [3];
  no_property local_11;
  StackTrace *local_10;
  StackTrace *this_local;
  
  local_10 = this;
  phmap::
  flat_hash_map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::flat_hash_map(&this->_read_write);
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>
  ::adjacency_list(&this->_local_stack,&local_11);
  local_30[0].addr = 0;
  vVar1 = boost::
          add_vertex<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config,boost::bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config>>
                    (local_30,&(this->_local_stack).super_type);
  this->_ce = vVar1;
  this->_root = this->_ce;
  this->_pop_count = 0;
  ipc::spinlock::spinlock(&this->lock);
  return;
}

Assistant:

StackTrace() : _ce(boost::add_vertex({0}, _local_stack)), _root(_ce) {}